

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O1

int __thiscall
CSnapshotDelta::UnpackDelta
          (CSnapshotDelta *this,CSnapshot *pFrom,CSnapshot *pTo,void *pSrcData,int DataSize)

{
  int i;
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  undefined1 *puVar6;
  uchar *puVar7;
  long lVar8;
  CSnapshot *pCVar9;
  ulong uVar10;
  undefined1 *puVar11;
  uint uVar12;
  long lVar13;
  uint *puVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  uint *puVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  CSnapshotBuilder Builder;
  
  puVar6 = &stack0xffffffffffffffd0;
  do {
    puVar11 = puVar6;
    *(undefined8 *)(puVar11 + -0x1000) = 0;
    puVar6 = puVar11 + -0x1000;
  } while (puVar11 + -0x1000 != Builder.m_aData + 0x10);
  *(CSnapshotDelta **)(puVar11 + -0x1060) = this;
  *(undefined8 *)(puVar11 + 0xfff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(puVar11 + 0xeff0) = 0;
  *(undefined4 *)(puVar11 + 0xfff4) = 0;
  iVar3 = -1;
  if (-1 < (long)*pSrcData) {
    uVar19 = (long)pSrcData + (long)*pSrcData * 4 + 0xc;
    *(ulong *)(puVar11 + -0x1070) = uVar19;
    if (uVar19 <= (ulong)((long)DataSize + (long)pSrcData)) {
      *(long *)(puVar11 + -0x1040) = (long)DataSize + (long)pSrcData;
      *(void **)(puVar11 + -0x1058) = pSrcData;
      *(CSnapshot **)(puVar11 + -0x1028) = pTo;
      piVar5 = (int *)(ulong)(uint)pFrom->m_NumItems;
      if (0 < pFrom->m_NumItems) {
        uVar19 = 0;
        do {
          iVar2 = (int)piVar5;
          iVar3 = (&pFrom[1].m_DataSize)[(long)iVar2 + uVar19];
          puVar18 = (uint *)((long)&(pFrom + 1)[iVar2].m_DataSize + (long)iVar3);
          pCVar9 = (CSnapshot *)(&pFrom[1].m_DataSize + (long)iVar2 + uVar19 + 1);
          if (uVar19 == iVar2 - 1) {
            pCVar9 = pFrom;
          }
          if (0 < (long)**(int **)(puVar11 + -0x1058)) {
            lVar13 = 0;
            do {
              if (*(uint *)((long)pSrcData + lVar13 * 4 + 0xc) == *puVar18) goto LAB_001cc7b0;
              lVar13 = lVar13 + 1;
            } while (**(int **)(puVar11 + -0x1058) != lVar13);
          }
          uVar12 = (pCVar9->m_DataSize - iVar3) - 4;
          uVar17 = *puVar18;
          *(undefined8 *)(puVar11 + -0x1080) = 0x1cc79f;
          pvVar4 = CSnapshotBuilder::NewItem
                             ((CSnapshotBuilder *)(puVar11 + -0x1010),(int)uVar17 >> 0x10,
                              uVar17 & 0xffff,uVar12);
          *(undefined8 *)(puVar11 + -0x1080) = 0x1cc7b0;
          mem_copy(pvVar4,puVar18 + 1,uVar12);
LAB_001cc7b0:
          uVar19 = uVar19 + 1;
          piVar5 = (int *)(long)pFrom->m_NumItems;
        } while ((long)uVar19 < (long)piVar5);
      }
      lVar13 = *(long *)(puVar11 + -0x1058);
      bVar1 = 0 < *(int *)(lVar13 + 4);
      puVar18 = *(uint **)(puVar11 + -0x1070);
      if (0 < *(int *)(lVar13 + 4)) {
        puVar14 = puVar18 + 2;
        puVar16 = *(uint **)(puVar11 + -0x1040);
        if (puVar14 <= puVar16) {
          *(CSnapshot **)(puVar11 + -0x1030) = pFrom + 1;
          *(long *)(puVar11 + -0x1048) = *(long *)(puVar11 + -0x1060) + 0x20080;
          *(int **)(puVar11 + -0x1038) = &pFrom[1].m_NumItems;
          uVar19 = 0;
          *(CSnapshot **)(puVar11 + -0x1050) = pFrom;
          do {
            uVar17 = *puVar18;
            uVar10 = (ulong)uVar17;
            piVar5 = (int *)0xfffffffd;
            if ((0x7fff < uVar10) || (uVar12 = puVar18[1], 0xffff < uVar12)) goto LAB_001cca20;
            if (((int)uVar17 < 0x40) &&
               (uVar15 = (uint)*(short *)(*(long *)(puVar11 + -0x1060) + uVar10 * 2), uVar15 != 0))
            {
              *(uint **)(puVar11 + -0x1070) = puVar14;
            }
            else {
              *(uint **)(puVar11 + -0x1070) = puVar18 + 3;
              if (puVar16 < puVar18 + 3) {
                piVar5 = (int *)0xfffffffe;
                goto LAB_001cca20;
              }
              if (0x1fffffff < *puVar14) goto LAB_001cca20;
              uVar15 = *puVar14 << 2;
            }
            if (((int)uVar15 < 0) ||
               (puVar16 < (uint *)((long)(int)uVar15 + *(long *)(puVar11 + -0x1070))))
            goto LAB_001cca20;
            *(ulong *)(puVar11 + -0x1068) = (ulong)uVar15;
            *(ulong *)(puVar11 + -0x1020) = uVar19;
            uVar15 = uVar17 << 0x10 | uVar12;
            if (0 < (long)*(int *)(puVar11 + 0xfff4)) {
              lVar8 = 0;
              do {
                if (*(uint *)(puVar11 + (long)*(int *)(puVar11 + lVar8 * 4 + 0xeff4) + -0x1010) ==
                    uVar15) {
                  puVar6 = puVar11 + (long)*(int *)(puVar11 + lVar8 * 4 + 0xeff4) + -0x100c;
                  goto LAB_001cc8e2;
                }
                lVar8 = lVar8 + 1;
              } while (*(int *)(puVar11 + 0xfff4) != lVar8);
            }
            puVar6 = (undefined1 *)0x0;
LAB_001cc8e2:
            if (puVar6 == (undefined1 *)0x0) {
              *(undefined8 *)(puVar11 + -0x1080) = 0x1cc8f8;
              puVar6 = (undefined1 *)
                       CSnapshotBuilder::NewItem
                                 ((CSnapshotBuilder *)(puVar11 + -0x1010),uVar17,uVar12,
                                  (int)*(undefined8 *)(puVar11 + -0x1068));
            }
            *(undefined8 *)(puVar11 + -0x1080) = 0x1cc906;
            iVar3 = CSnapshot::GetItemIndex(pFrom,uVar15);
            if (iVar3 == -1) {
              pvVar4 = *(void **)(puVar11 + -0x1070);
              uVar17 = (uint)*(undefined8 *)(puVar11 + -0x1068);
              *(undefined8 *)(puVar11 + -0x1080) = 0x1cc9ca;
              mem_copy(puVar6,pvVar4,uVar17);
              piVar5 = (int *)(*(long *)(puVar11 + -0x1060) + 0x80 + uVar10 * 4);
              *piVar5 = *piVar5 + uVar17 * 8;
              piVar5 = (int *)(*(long *)(puVar11 + -0x1048) + uVar10 * 4);
            }
            else {
              pvVar4 = *(void **)(puVar11 + -0x1070);
              if (3 < *(uint *)(puVar11 + -0x1068)) {
                iVar2 = *(int *)(*(long *)(puVar11 + -0x1050) + 4);
                iVar3 = *(int *)(*(long *)(puVar11 + -0x1030) + (long)iVar2 * 4 + (long)iVar3 * 4);
                pvVar4 = *(void **)(puVar11 + -0x1070);
                lVar13 = *(long *)(puVar11 + -0x1038);
                uVar19 = *(ulong *)(puVar11 + -0x1068);
                lVar8 = 0;
                do {
                  *(int *)(puVar6 + lVar8 * 4) =
                       *(int *)((long)pvVar4 + lVar8 * 4) +
                       *(int *)((long)iVar3 + (long)iVar2 * 8 + lVar13 + lVar8 * 4);
                  i = *(int *)((long)pvVar4 + lVar8 * 4);
                  if (i == 0) {
                    piVar5 = (int *)(*(long *)(puVar11 + -0x1060) + 0x80 + uVar10 * 4);
                    *piVar5 = *piVar5 + 1;
                  }
                  else {
                    *(undefined8 *)(puVar11 + -0x1080) = 0x1cc96b;
                    puVar7 = CVariableInt::Pack(puVar11 + -0x1015,i);
                    pvVar4 = *(void **)(puVar11 + -0x1070);
                    piVar5 = (int *)(*(long *)(puVar11 + -0x1060) + 0x80 + uVar10 * 4);
                    *piVar5 = *piVar5 + ((int)puVar7 - (int)(puVar11 + -0x1015)) * 8;
                  }
                  lVar8 = lVar8 + 1;
                } while (((uint)(uVar19 >> 2) & 0x3fffffff) != (uint)lVar8);
              }
              piVar5 = (int *)(*(long *)(puVar11 + -0x1048) + uVar10 * 4);
              lVar13 = *(long *)(puVar11 + -0x1058);
              pFrom = *(CSnapshot **)(puVar11 + -0x1050);
              uVar17 = (uint)*(undefined8 *)(puVar11 + -0x1068);
            }
            *piVar5 = *piVar5 + 1;
            uVar12 = (int)*(undefined8 *)(puVar11 + -0x1020) + 1;
            uVar19 = (ulong)uVar12;
            bVar1 = (int)uVar12 < *(int *)(lVar13 + 4);
            puVar16 = *(uint **)(puVar11 + -0x1040);
            if (*(int *)(lVar13 + 4) <= (int)uVar12) goto LAB_001cca20;
            puVar14 = (uint *)((long)pvVar4 + (ulong)(uVar17 & 0xfffffffc) + 8);
            puVar18 = (uint *)((long)pvVar4 + (ulong)(uVar17 & 0xfffffffc));
          } while (puVar14 <= puVar16);
        }
        piVar5 = (int *)0xffffffff;
      }
LAB_001cca20:
      iVar3 = (int)piVar5;
      if (!bVar1) {
        *(undefined8 *)(puVar11 + -0x1080) = 0x1cca34;
        iVar3 = CSnapshotBuilder::Finish
                          ((CSnapshotBuilder *)(puVar11 + -0x1010),*(void **)(puVar11 + -0x1028));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar11 + 0xfff8)) {
    *(undefined **)(puVar11 + -0x1080) = &UNK_001cca65;
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int CSnapshotDelta::UnpackDelta(const CSnapshot *pFrom, CSnapshot *pTo, const void *pSrcData, int DataSize)
{
	CSnapshotBuilder Builder;
	const CData *pDelta = (const CData *)pSrcData;
	const int *pData = (const int *)pDelta->m_pData;
	const int *pEnd = (const int *)(((const char *)pSrcData + DataSize));

	const CSnapshotItem *pFromItem;
	int Keep, ItemSize;
	const int *pDeleted;
	int ID, Type, Key;
	int FromIndex;
	int *pNewData;

	Builder.Init();

	// unpack deleted stuff
	pDeleted = pData;
	if(pDelta->m_NumDeletedItems < 0)
		return -1;
	pData += pDelta->m_NumDeletedItems;
	if(pData > pEnd)
		return -1;

	// copy all non deleted stuff
	for(int i = 0; i < pFrom->NumItems(); i++)
	{
		// dbg_assert(0, "fail!");
		pFromItem = pFrom->GetItem(i);
		ItemSize = pFrom->GetItemSize(i);
		Keep = 1;
		for(int d = 0; d < pDelta->m_NumDeletedItems; d++)
		{
			if(pDeleted[d] == pFromItem->Key())
			{
				Keep = 0;
				break;
			}
		}

		if(Keep)
		{
			// keep it
			mem_copy(
				Builder.NewItem(pFromItem->Type(), pFromItem->ID(), ItemSize),
				pFromItem->Data(), ItemSize);
		}
	}

	// unpack updated stuff
	for(int i = 0; i < pDelta->m_NumUpdateItems; i++)
	{
		if(pData+2 > pEnd)
			return -1;

		Type = *pData++;
		if(Type < 0 || Type > CSnapshot::MAX_TYPE)
			return -3;

		ID = *pData++;
		if(ID < 0 || ID > CSnapshot::MAX_ID)
			return -3;

		if(Type < MAX_NETOBJSIZES && m_aItemSizes[Type])
			ItemSize = m_aItemSizes[Type];
		else
		{
			if(pData+1 > pEnd)
				return -2;
			if(*pData < 0 || *pData > INT_MAX / 4)
				return -3;
			ItemSize = (*pData++) * 4;
		}

		if(RangeCheck(pEnd, pData, ItemSize) || ItemSize < 0) return -3;

		Key = (Type<<16)|(ID&0xffff);

		// create the item if needed
		pNewData = Builder.GetItemData(Key);
		if(!pNewData)
			pNewData = (int *)Builder.NewItem(Key>>16, Key&0xffff, ItemSize);

		//if(range_check(pEnd, pNewData, ItemSize)) return -4;

		FromIndex = pFrom->GetItemIndex(Key);
		if(FromIndex != -1)
		{
			// we got an update so we need to apply the diff
			UndiffItem(pFrom->GetItem(FromIndex)->Data(), pData, pNewData, ItemSize / 4, &m_aSnapshotDataRate[Type]);
			m_aSnapshotDataUpdates[Type]++;
		}
		else // no previous, just copy the pData
		{
			mem_copy(pNewData, pData, ItemSize);
			m_aSnapshotDataRate[Type] += ItemSize * 8;
			m_aSnapshotDataUpdates[Type]++;
		}

		pData += ItemSize/4;
	}

	// finish up
	return Builder.Finish(pTo);
}